

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

void __thiscall EventDispatcher::handleSyncEvent(EventDispatcher *this,Event *ev)

{
  if ((ev != (Event *)0x0) && (*(int *)&(ev->super_RefCount).field_0xc == -3)) {
    EventDispatcherHelper::dispatchEvent
              (&this->mDispatcher,(Event *)ev[1].super_RefCount._vptr_RefCount);
    Mutex::Lock(&this->mSyncLock);
    *(undefined1 *)&ev[1].super_RefCount.mRefCount = 1;
    Mutex::Unlock(&this->mSyncLock);
    Condition::Broadcast(&this->mSyncWait);
    return;
  }
  jh_log_print(1,"void EventDispatcher::handleSyncEvent(Event *)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
               ,0x148,"event must not be NULL");
  return;
}

Assistant:

void EventDispatcher::handleSyncEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	SyncEventHolder *holder = event_cast<SyncEventHolder>( ev );

	if ( holder == NULL)
	{
		LOG_ERR_FATAL("event must not be NULL");
		return;
	}	

	mDispatcher.dispatchEvent( holder->mRealEvent );
	mSyncLock.Lock();
	holder->mDone = true;
	mSyncLock.Unlock();
	mSyncWait.Broadcast();
	// ev will get deleted in the caller.
}